

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O2

void __thiscall
pstore::region::mem_based_factory::mem_based_factory
          (mem_based_factory *this,shared_ptr<pstore::file::in_memory> *file,uint64_t full_size,
          uint64_t min_size)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  factory::factory(&this->super_factory,full_size,min_size);
  (this->super_factory)._vptr_factory = (_func_int **)&PTR__mem_based_factory_00193320;
  (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->file_).super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (file->super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

mem_based_factory::mem_based_factory (std::shared_ptr<file::in_memory> file,
                                              std::uint64_t const full_size,
                                              std::uint64_t const min_size)
                : factory{full_size, min_size}
                , file_{std::move (file)} {}